

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> * __thiscall
pstore::dump::number_base::write_decimal<long_long,std::wostream>
          (number_base *this,longlong value,basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os)

{
  uint uVar1;
  uint uVar2;
  wostream *pwVar3;
  wostream *pwVar4;
  long lVar5;
  uint uVar6;
  wostream *pwVar7;
  
  lVar5 = *(long *)(*(long *)os + -0x18);
  pwVar7 = os + lVar5 + 0x18;
  uVar1 = *(uint *)pwVar7;
  uVar6 = this->base_;
  uVar2 = uVar1;
  if (uVar6 == 8) {
    if (value != 0) {
      std::operator<<(os,"0");
      lVar5 = *(long *)(*(long *)os + -0x18);
      uVar2 = *(uint *)(os + lVar5 + 0x18);
    }
    pwVar4 = os + lVar5;
    uVar6 = 0x40;
  }
  else {
    if (uVar6 == 10) {
      uVar6 = 2;
      pwVar4 = pwVar7;
      goto LAB_0017451d;
    }
    if (uVar6 != 0x10) {
      assert_failed("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/dump/value.hpp"
                    ,0xa3);
    }
    pwVar3 = std::operator<<(os,"0x");
    pwVar4 = pwVar3 + *(long *)(*(long *)pwVar3 + -0x18);
    uVar2 = *(uint *)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0x18);
    uVar6 = 8;
  }
  pwVar4 = pwVar4 + 0x18;
LAB_0017451d:
  *(uint *)pwVar4 = uVar2 & 0xffffffb5 | uVar6;
  pwVar4 = std::wostream::_M_insert<long_long>((longlong)os);
  *(uint *)pwVar7 = uVar1;
  return pwVar4;
}

Assistant:

OStream & write_decimal (T value, OStream & os) const {
                ios_flags_saver const _{os};
                switch (base_) {
                case 16: os << "0x" << std::hex; break;
                case 8:
                    if (value != 0) {
                        os << "0";
                    }
                    os << std::oct;
                    break;
                case 10: os << std::dec; break;
                default: PSTORE_ASSERT (0); break;
                }
                return os << value;
            }